

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_emptytableref.cpp
# Opt level: O3

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,EmptyTableRef *ref)

{
  idx_t iVar1;
  element_type *peVar2;
  
  iVar1 = GenerateTableIndex((Binder *)ref);
  peVar2 = (element_type *)operator_new(0x20);
  *(undefined1 *)
   &((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar2->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8))->_M_pi = 8;
  peVar2->context = (ClientContext *)0x0;
  *(undefined ***)&(peVar2->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ =
       &PTR__BoundTableRef_0244c570;
  (peVar2->CTE_bindings)._M_h._M_buckets = (__buckets_ptr)iVar1;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(EmptyTableRef &ref) {
	return make_uniq<BoundEmptyTableRef>(GenerateTableIndex());
}